

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1533.c
# Opt level: O3

size_t read_callback(void *ptr,size_t size,size_t nitems,void *userdata)

{
  ulong __n;
  
  if (*(int *)((long)userdata + 8) == 0) {
    *(undefined4 *)((long)userdata + 0xc) = 1;
    __n = 0x10000001;
  }
  else {
    __n = nitems * size;
    if (*(ulong *)((long)userdata + 0x10) < nitems * size) {
      __n = *(ulong *)((long)userdata + 0x10);
    }
    memset(ptr,0x61,__n);
    *(long *)((long)userdata + 0x10) = *(long *)((long)userdata + 0x10) - __n;
  }
  return __n;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nitems,
                            void *userdata)
{
  struct cb_data *data = (struct cb_data *)userdata;

  /* wait until the server has sent all response headers */
  if(data->response_received) {
    size_t totalsize = nitems * size;

    size_t bytes_to_send = data->remaining_bytes;
    if(bytes_to_send > totalsize) {
      bytes_to_send = totalsize;
    }

    memset(ptr, 'a', bytes_to_send);
    data->remaining_bytes -= bytes_to_send;

    return bytes_to_send;
  }
  else {
    data->paused = 1;
    return CURL_READFUNC_PAUSE;
  }
}